

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O0

void duckdb::AggregateExecutor::Finalize<duckdb::udf_covar_state_t,int,duckdb::UDFCovarPopOperation>
               (Vector *states,AggregateInputData *aggr_input_data,Vector *result,idx_t count,
               idx_t offset)

{
  VectorType VVar1;
  udf_covar_state_t *in_RCX;
  Vector *in_RDX;
  AggregateInputData *in_RSI;
  Vector *in_RDI;
  long in_R8;
  idx_t i;
  AggregateFinalizeData finalize_data_1;
  int *rdata_1;
  udf_covar_state_t **sdata_1;
  AggregateFinalizeData finalize_data;
  int *rdata;
  udf_covar_state_t **sdata;
  int *in_stack_ffffffffffffff78;
  udf_covar_state_t *in_stack_ffffffffffffff80;
  udf_covar_state_t *state;
  AggregateFinalizeData local_78;
  int *local_60;
  udf_covar_state_t **local_58;
  AggregateFinalizeData local_50;
  int *local_38;
  udf_covar_state_t **local_30;
  long local_28;
  udf_covar_state_t *local_20;
  Vector *local_18;
  AggregateInputData *local_10;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  VVar1 = Vector::GetVectorType(in_RDI);
  if (VVar1 == CONSTANT_VECTOR) {
    duckdb::Vector::SetVectorType((VectorType)local_18);
    local_30 = ConstantVector::GetData<duckdb::udf_covar_state_t*>((Vector *)0x515a30);
    local_38 = ConstantVector::GetData<int>((Vector *)0x515a3f);
    AggregateFinalizeData::AggregateFinalizeData(&local_50,local_18,local_10);
    UDFCovarPopOperation::Finalize<int,duckdb::udf_covar_state_t>
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,(AggregateFinalizeData *)0x515a6f
              );
  }
  else {
    duckdb::Vector::SetVectorType((VectorType)local_18);
    local_58 = FlatVector::GetData<duckdb::udf_covar_state_t*>((Vector *)0x515a8d);
    local_60 = FlatVector::GetData<int>((Vector *)0x515a9c);
    AggregateFinalizeData::AggregateFinalizeData(&local_78,local_18,local_10);
    for (state = (udf_covar_state_t *)0x0; state < local_20;
        state = (udf_covar_state_t *)((long)&state->count + 1)) {
      local_78.result_idx = (long)&state->count + local_28;
      UDFCovarPopOperation::Finalize<int,duckdb::udf_covar_state_t>
                (state,in_stack_ffffffffffffff78,(AggregateFinalizeData *)0x515b02);
    }
  }
  return;
}

Assistant:

static void Finalize(Vector &states, AggregateInputData &aggr_input_data, Vector &result, idx_t count,
	                     idx_t offset) {
		if (states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);

			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			auto rdata = ConstantVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			OP::template Finalize<RESULT_TYPE, STATE_TYPE>(**sdata, *rdata, finalize_data);
		} else {
			D_ASSERT(states.GetVectorType() == VectorType::FLAT_VECTOR);
			result.SetVectorType(VectorType::FLAT_VECTOR);

			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			auto rdata = FlatVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			for (idx_t i = 0; i < count; i++) {
				finalize_data.result_idx = i + offset;
				OP::template Finalize<RESULT_TYPE, STATE_TYPE>(*sdata[i], rdata[finalize_data.result_idx],
				                                               finalize_data);
			}
		}
	}